

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alice.cpp
# Opt level: O2

void __thiscall Alice::BlindPermuteProgram(Alice *this)

{
  uint uVar1;
  pointer pvVar2;
  pointer pvVar3;
  Server *this_00;
  ulong uVar4;
  ostream *poVar5;
  pointer pIVar6;
  undefined1 auVar7 [8];
  ulong uVar8;
  int j;
  long lVar9;
  long lVar10;
  int j_1;
  long lVar11;
  _Vector_base<Instruction,_std::allocator<Instruction>_> local_80;
  _Vector_base<Instruction,_std::allocator<Instruction>_> local_68;
  undefined1 local_50 [8];
  vector<Instruction,_std::allocator<Instruction>_> V;
  
  std::vector<Instruction,_std::allocator<Instruction>_>::vector
            ((vector<Instruction,_std::allocator<Instruction>_> *)local_50,
             (long)(this->super_Party).n_p,(allocator_type *)&local_68);
  uVar1 = (this->super_Party).n_p;
  pvVar2 = (this->super_Party).P.
           super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pvVar3 = (this->super_Party).R_P.
           super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar8 = 0;
  uVar4 = (ulong)uVar1;
  auVar7 = local_50;
  if ((int)uVar1 < 1) {
    uVar4 = uVar8;
  }
  for (; uVar8 != uVar4; uVar8 = uVar8 + 1) {
    lVar10 = *(long *)&pvVar2[uVar8].super__Vector_base<long,_std::allocator<long>_>._M_impl.
                       super__Vector_impl_data;
    lVar11 = *(long *)&pvVar3[uVar8].super__Vector_base<long,_std::allocator<long>_>._M_impl.
                       super__Vector_impl_data;
    for (lVar9 = 0; lVar9 != 5; lVar9 = lVar9 + 1) {
      ((pointer)auVar7)->val[lVar9] = *(long *)(lVar11 + lVar9 * 8) + *(long *)(lVar10 + lVar9 * 8);
    }
    auVar7 = (undefined1  [8])((long)auVar7 + 0x28);
  }
  this_00 = this->srv;
  std::vector<Instruction,_std::allocator<Instruction>_>::vector
            ((vector<Instruction,_std::allocator<Instruction>_> *)&local_80,
             (vector<Instruction,_std::allocator<Instruction>_> *)local_50);
  Server::SendProgramVector
            (this_00,(vector<Instruction,_std::allocator<Instruction>_> *)&local_80,
             (this->super_Party).n_p);
  std::_Vector_base<Instruction,_std::allocator<Instruction>_>::~_Vector_base(&local_80);
  Server::ReceiveProgramVector
            ((vector<Instruction,_std::allocator<Instruction>_> *)&local_68,this->srv);
  std::vector<Instruction,_std::allocator<Instruction>_>::operator=
            ((vector<Instruction,_std::allocator<Instruction>_> *)local_50,
             (vector<Instruction,_std::allocator<Instruction>_> *)&local_68);
  std::_Vector_base<Instruction,_std::allocator<Instruction>_>::~_Vector_base(&local_68);
  std::operator<<((ostream *)&std::cout,"Alice\'s Permuted Program P_A:\n");
  lVar10 = 0;
  pIVar6 = (pointer)0x0;
  while ((long)pIVar6 < (long)(this->super_Party).n_p) {
    V.super__Vector_base<Instruction,_std::allocator<Instruction>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = pIVar6;
    for (lVar11 = 0; lVar11 != 5; lVar11 = lVar11 + 1) {
      *(long *)(*(long *)&(this->super_Party).P.
                          super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[(long)pIVar6].
                          super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data + lVar11 * 8) =
           *(long *)(*(long *)&(this->Pi_P_diff_R_PB_R_PA).
                               super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[(long)pIVar6].
                               super__Vector_base<long,_std::allocator<long>_>._M_impl.
                               super__Vector_impl_data + lVar11 * 8) +
           *(long *)((long)(long *)local_50 + lVar11 * 8 + lVar10);
      poVar5 = std::ostream::_M_insert<long>((long)&std::cout);
      std::operator<<(poVar5," ");
    }
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    lVar10 = lVar10 + 0x28;
    pIVar6 = (pointer)((long)(V.super__Vector_base<Instruction,_std::allocator<Instruction>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage)->val + 1);
  }
  std::_Vector_base<Instruction,_std::allocator<Instruction>_>::~_Vector_base
            ((_Vector_base<Instruction,_std::allocator<Instruction>_> *)local_50);
  return;
}

Assistant:

void Alice::BlindPermuteProgram()
{
    std::vector<Instruction> V(n_p);
    for(int i=0; i<n_p; i++)
        for(int j=0; j<5; j++)
            V[i].val[j] = P[i][j] + R_P[i][j];
    srv->SendProgramVector(V, n_p);
    V = srv->ReceiveProgramVector();
    std::cout<<"Alice's Permuted Program P_A:\n";
    for(int i=0; i<n_p; i++){
        for(int j=0; j<5; j++){
            P[i][j] = V[i].val[j] + Pi_P_diff_R_PB_R_PA[i][j];
            std::cout<<P[i][j]<<" ";
        }
        std::cout<<std::endl;
    }
}